

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O1

int __thiscall zmq::ctx_t::unregister_endpoint(ctx_t *this,string *addr_,socket_base_t *socket_)

{
  iterator __position;
  int *piVar1;
  int iVar2;
  scoped_lock_t locker;
  scoped_lock_t sStack_28;
  
  scoped_lock_t::scoped_lock_t(&sStack_28,&this->_endpoints_sync);
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>_>
               ::find(&(this->_endpoints)._M_t,addr_);
  if (((_Rb_tree_header *)__position._M_node ==
       &(this->_endpoints)._M_t._M_impl.super__Rb_tree_header) ||
     (*(socket_base_t **)(__position._M_node + 2) != socket_)) {
    piVar1 = __errno_location();
    *piVar1 = 2;
    iVar2 = -1;
  }
  else {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>_>
    ::_M_erase_aux(&(this->_endpoints)._M_t,(const_iterator)__position._M_node);
    iVar2 = 0;
  }
  scoped_lock_t::~scoped_lock_t(&sStack_28);
  return iVar2;
}

Assistant:

int zmq::ctx_t::unregister_endpoint (const std::string &addr_,
                                     const socket_base_t *const socket_)
{
    scoped_lock_t locker (_endpoints_sync);

    const endpoints_t::iterator it = _endpoints.find (addr_);
    if (it == _endpoints.end () || it->second.socket != socket_) {
        errno = ENOENT;
        return -1;
    }

    //  Remove endpoint.
    _endpoints.erase (it);

    return 0;
}